

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O2

string * __thiscall
benchmark::ToBinaryStringFullySpecified_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,double value,double threshold,
          int precision)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int64_t exponent;
  string mantissa;
  benchmark *local_50;
  string local_48;
  string local_28;
  
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  ToExponentAndMantissa(value,threshold,(int)this,1024.0,&local_48,(int64_t *)&local_50);
  ExponentToPrefix_abi_cxx11_(&local_28,local_50,0,SUB81(paVar1,0));
  std::operator+(__return_storage_ptr__,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ToBinaryStringFullySpecified(double value, double threshold,
                                         int precision) {
  std::string mantissa;
  int64_t exponent;
  ToExponentAndMantissa(value, threshold, precision, 1024.0, &mantissa,
                        &exponent);
  return mantissa + ExponentToPrefix(exponent, false);
}